

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int convert(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  _func_int ***ppp_Var8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *p_Var9;
  undefined4 format;
  undefined8 uVar10;
  polymorphic_allocator<float> pVar11;
  float *pfVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  Allocator AVar17;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)> to;
  Tuple2<pbrt::Point2,_int> TVar18;
  uint uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  size_type sVar21;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar22;
  int i;
  uint uVar23;
  ImageChannelValues *__it2;
  ImageChannelValues *__it2_00;
  ImageChannelValues *extraout_RDX;
  ImageChannelValues *__it2_01;
  ImageChannelValues *extraout_RDX_00;
  ImageChannelValues *extraout_RDX_01;
  ImageChannelValues *extraout_RDX_02;
  ImageChannelValues *extraout_RDX_03;
  ImageChannelValues *extraout_RDX_04;
  ImageChannelValues *extraout_RDX_05;
  ImageChannelValues *extraout_RDX_06;
  ImageChannelValues *extraout_RDX_07;
  ImageChannelValues *pIVar24;
  ImageChannelValues *pIVar25;
  ImageChannelValues *extraout_RDX_08;
  ImageChannelValues *extraout_RDX_09;
  ImageChannelValues *extraout_RDX_10;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar26;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar27;
  string *name;
  optional<float> oVar28;
  long lVar29;
  Point2i resolution;
  undefined1 other [8];
  int c;
  int iVar30;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)> from;
  string *psVar31;
  long lVar32;
  size_t sVar33;
  char *pcVar34;
  char ch;
  _Rb_tree_node_base *in_R8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int iVar35;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar36;
  ulong uVar37;
  ulong uVar38;
  size_t sVar39;
  int c_2;
  int iVar40;
  int iVar41;
  Point2i PVar42;
  _Alloc_hider _Var43;
  Float FVar44;
  float fVar45;
  undefined1 auVar47 [16];
  float fVar46;
  undefined1 extraout_var [60];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  span<int> out;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  string_view str;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  bool bw;
  bool preserveColors;
  bool tonemap;
  bool flipy;
  bool acesFilmic;
  ImageChannelDesc desc;
  int repeat;
  float scale;
  Float despikeLimit;
  Float maxY;
  float gamma;
  vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> neighbors;
  array<int,_4UL> cropWindow;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitChannelNames;
  ImageChannelValues channels;
  string channelNames;
  string inFile;
  string colorspace;
  string outFile;
  ImageAndMetadata imRead;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_9d0;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_9c8;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_9c0;
  bool local_9b5;
  bool local_9b4;
  bool local_9b3;
  bool local_9b2;
  bool local_9b1;
  ulong local_9b0;
  undefined1 local_9a8 [32];
  size_t local_988;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_980;
  char **local_978;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_970;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_968;
  int local_95c;
  float local_958;
  float local_954;
  float local_950;
  float local_94c;
  undefined1 local_948 [8];
  pointer pIStack_940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_938;
  undefined1 local_928 [16];
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_918;
  undefined1 local_8e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8d8;
  undefined1 auStack_8c8 [32];
  long local_8a8 [2];
  long alStack_898 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_858;
  size_t sStack_848;
  size_t local_840;
  optional<int> oStack_838;
  undefined1 auStack_830 [32];
  polymorphic_allocator<pbrt::Half> pStack_810;
  _Base_ptr p_Stack_808;
  _Base_ptr local_800;
  _Base_ptr local_7f8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  uint local_7ac;
  string local_7a8;
  string local_788;
  long local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 local_720 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_710;
  optional<int> local_670;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> vStack_668;
  undefined1 local_648 [16];
  size_t sStack_638;
  undefined8 uStack_630;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> vStack_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  _Any_data local_528;
  code *local_518;
  code *local_510;
  _Any_data local_508;
  code *local_4f8;
  code *local_4f0;
  _Any_data local_4e8;
  code *local_4d8;
  code *local_4d0;
  _Any_data local_4c8;
  code *local_4b8;
  code *local_4b0;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  _Any_data local_488;
  code *local_478;
  code *local_470;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  _Rb_tree_node_base local_428;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_398;
  Tuple2<pbrt::Point2,_int> local_390;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  undefined1 local_360 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  optional<int> local_2b0;
  polymorphic_allocator<unsigned_char> pStack_2a8;
  undefined1 local_2a0 [16];
  size_t sStack_290;
  polymorphic_allocator<pbrt::Half> local_288;
  Half *pHStack_280;
  size_t sStack_278;
  size_t sStack_270;
  polymorphic_allocator<float> pStack_268;
  Half *pHStack_260;
  size_t sStack_258;
  size_t sStack_250;
  aligned_storage_t<sizeof(float),_alignof(float)> local_248;
  bool local_244;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_240;
  bool local_200;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_1fc;
  bool local_1bc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_1b8;
  bool local_1a8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_1a4;
  bool local_19c;
  aligned_storage_t<sizeof(int),_alignof(int)> local_198;
  bool local_194;
  aligned_storage_t<sizeof(float),_alignof(float)> local_190;
  bool local_18c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_188;
  bool local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  undefined1 local_148 [8];
  undefined1 local_140 [64];
  char local_100;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_fc;
  char local_bc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_b8;
  char local_a8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_a4;
  char local_9c;
  aligned_storage_t<sizeof(int),_alignof(int)> local_98;
  char local_94;
  aligned_storage_t<sizeof(float),_alignof(float)> local_90;
  char local_8c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_88;
  char local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_78;
  optional<int> local_48;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_9b1 = false;
  local_95c = 1;
  local_9b2 = false;
  local_9b3 = false;
  local_954 = INFINITY;
  local_9b4 = false;
  local_9b5 = false;
  local_958 = 1.0;
  local_94c = 1.0;
  local_950 = 1.0;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_7a8._M_string_length = 0;
  local_7a8.field_2._M_local_buf[0] = '\0';
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  local_740._M_string_length = 0;
  local_740.field_2._M_local_buf[0] = '\0';
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  local_760._M_string_length = 0;
  local_760.field_2._M_local_buf[0] = '\0';
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  local_7d0._M_string_length = 0;
  local_7d0.field_2._M_local_buf[0] = '\0';
  local_928._0_8_ = (pointer)0xffffffff;
  local_928._8_8_ = 0xffffffff;
  local_978 = argv;
  if (*argv != (char *)0x0) {
    do {
      local_360._0_8_ = &local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"acesfilmic","");
      local_388._M_unused._M_object = (void *)0x0;
      local_388._8_8_ = 0;
      local_370 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_invoke;
      local_378 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                  ::_M_manager;
      bVar13 = pbrt::ParseArg<bool*>
                         (&local_978,(string *)local_360,&local_9b1,
                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                           *)&local_388);
      bVar14 = true;
      if (!bVar13) {
        local_720._0_8_ = &local_710;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"bw","");
        local_3c8._M_unused._M_object = (void *)0x0;
        local_3c8._8_8_ = 0;
        local_3b0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_invoke;
        local_3b8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                    ::_M_manager;
        bVar13 = pbrt::ParseArg<bool*>
                           (&local_978,(string *)local_720,&local_9b5,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_3c8);
        bVar14 = true;
        if (!bVar13) {
          local_8e8._0_8_ = &aStack_8d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"channels","");
          local_3e8._M_unused._M_object = (void *)0x0;
          local_3e8._8_8_ = 0;
          local_3d0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_invoke;
          local_3d8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                      ::_M_manager;
          bVar13 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_978,(string *)local_8e8,&local_7d0,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_3e8);
          bVar14 = true;
          if (!bVar13) {
            local_148 = (undefined1  [8])(local_140 + 8);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"colorspace","");
            local_408._M_unused._M_object = (void *)0x0;
            local_408._8_8_ = 0;
            local_3f0 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                        ::_M_invoke;
            local_3f8 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                        ::_M_manager;
            bVar13 = pbrt::ParseArg<std::__cxx11::string*>
                               (&local_978,(string *)local_148,&local_760,
                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                 *)&local_408);
            bVar14 = true;
            if (!bVar13) {
              local_9a8._0_8_ = local_9a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"crop","");
              local_428._M_color = _S_red;
              local_428._4_4_ = 0;
              local_428._M_parent = (_Base_ptr)0x0;
              local_428._M_right =
                   (_Base_ptr)
                   std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                   ::_M_invoke;
              local_428._M_left =
                   (_Base_ptr)
                   std::
                   _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                   ::_M_manager;
              in_R8 = &local_428;
              out.n = (size_t)in_R8;
              out.ptr = (int *)0x4;
              bVar13 = pbrt::ParseArg<pstd::span<int>>
                                 ((pbrt *)&local_978,(char ***)local_9a8,(string *)local_928,out,
                                  in_R9);
              bVar14 = true;
              if (!bVar13) {
                local_918.alloc.memoryResource = (memory_resource *)&local_918.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&((string *)local_928)->field_2,"despike","");
                local_448._M_unused._M_object = (void *)0x0;
                local_448._8_8_ = 0;
                local_430 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                            ::_M_invoke;
                local_438 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                            ::_M_manager;
                bVar13 = pbrt::ParseArg<float*>
                                   (&local_978,(string *)&((string *)local_928)->field_2,&local_954,
                                    (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_448);
                bVar14 = true;
                if (!bVar13) {
                  local_948 = (undefined1  [8])&local_938;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"flipy","");
                  local_468._M_unused._M_object = (void *)0x0;
                  local_468._8_8_ = 0;
                  local_450 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                              ::_M_invoke;
                  local_458 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                              ::_M_manager;
                  bVar13 = pbrt::ParseArg<bool*>
                                     (&local_978,(string *)local_948,&local_9b2,
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_468);
                  bVar14 = true;
                  if (!bVar13) {
                    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"gamma","")
                    ;
                    local_488._M_unused._M_object = (void *)0x0;
                    local_488._8_8_ = 0;
                    local_470 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                ::_M_invoke;
                    local_478 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                ::_M_manager;
                    bVar13 = pbrt::ParseArg<float*>
                                       (&local_978,&local_788,&local_94c,
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)&local_488);
                    bVar14 = true;
                    if (!bVar13) {
                      local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_568,"maxluminance","");
                      local_4a8._M_unused._M_object = (void *)0x0;
                      local_4a8._8_8_ = 0;
                      local_490 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                  ::_M_invoke;
                      local_498 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                  ::_M_manager;
                      bVar13 = pbrt::ParseArg<float*>
                                         (&local_978,&local_568,&local_950,
                                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                           *)&local_4a8);
                      bVar14 = true;
                      if (!bVar13) {
                        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_588,"outfile","");
                        local_4c8._M_unused._M_object = (void *)0x0;
                        local_4c8._8_8_ = 0;
                        local_4b0 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                    ::_M_invoke;
                        local_4b8 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                    ::_M_manager;
                        bVar13 = pbrt::ParseArg<std::__cxx11::string*>
                                           (&local_978,&local_588,&local_740,
                                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                             *)&local_4c8);
                        bVar14 = true;
                        if (!bVar13) {
                          local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_5a8,"preservecolors","");
                          local_4e8._M_unused._M_object = (void *)0x0;
                          local_4e8._8_8_ = 0;
                          local_4d0 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                      ::_M_invoke;
                          local_4d8 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                      ::_M_manager;
                          bVar13 = pbrt::ParseArg<bool*>
                                             (&local_978,&local_5a8,&local_9b4,
                                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                               *)&local_4e8);
                          bVar14 = true;
                          if (!bVar13) {
                            local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_5c8,"repeatpix","");
                            local_508._M_unused._M_object = (void *)0x0;
                            local_508._8_8_ = 0;
                            local_4f0 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                        ::_M_invoke;
                            local_4f8 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                        ::_M_manager;
                            bVar13 = pbrt::ParseArg<int*>
                                               (&local_978,&local_5c8,&local_95c,
                                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                 *)&local_508);
                            bVar14 = true;
                            if (!bVar13) {
                              local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_5e8,"scale","");
                              local_528._M_unused._M_object = (void *)0x0;
                              local_528._8_8_ = 0;
                              local_510 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                          ::_M_invoke;
                              local_518 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                          ::_M_manager;
                              bVar13 = pbrt::ParseArg<float*>
                                                 (&local_978,&local_5e8,&local_958,
                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_528);
                              bVar14 = true;
                              if (!bVar13) {
                                local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_608,"tonemap","");
                                local_548._M_unused._M_object = (void *)0x0;
                                local_548._8_8_ = 0;
                                local_530 = std::
                                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                            ::_M_invoke;
                                local_538 = std::
                                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1363:24)>
                                            ::_M_manager;
                                bVar14 = pbrt::ParseArg<bool*>
                                                   (&local_978,&local_608,&local_9b3,
                                                    (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_548);
                                if (local_538 != (code *)0x0) {
                                  (*local_538)(&local_548,&local_548,__destroy_functor);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_608._M_dataplus._M_p != &local_608.field_2) {
                                  operator_delete(local_608._M_dataplus._M_p,
                                                  local_608.field_2._M_allocated_capacity + 1);
                                }
                              }
                              if (local_518 != (code *)0x0) {
                                (*local_518)(&local_528,&local_528,__destroy_functor);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
                                operator_delete(local_5e8._M_dataplus._M_p,
                                                local_5e8.field_2._M_allocated_capacity + 1);
                              }
                            }
                            if (local_4f8 != (code *)0x0) {
                              (*local_4f8)(&local_508,&local_508,__destroy_functor);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
                              operator_delete(local_5c8._M_dataplus._M_p,
                                              local_5c8.field_2._M_allocated_capacity + 1);
                            }
                          }
                          if (local_4d8 != (code *)0x0) {
                            (*local_4d8)(&local_4e8,&local_4e8,__destroy_functor);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                            operator_delete(local_5a8._M_dataplus._M_p,
                                            local_5a8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if (local_4b8 != (code *)0x0) {
                          (*local_4b8)(&local_4c8,&local_4c8,__destroy_functor);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_588._M_dataplus._M_p != &local_588.field_2) {
                          operator_delete(local_588._M_dataplus._M_p,
                                          local_588.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if (local_498 != (code *)0x0) {
                        (*local_498)(&local_4a8,&local_4a8,__destroy_functor);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_568._M_dataplus._M_p != &local_568.field_2) {
                        operator_delete(local_568._M_dataplus._M_p,
                                        local_568.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (local_478 != (code *)0x0) {
                      (*local_478)(&local_488,&local_488,__destroy_functor);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_788._M_dataplus._M_p != &local_788.field_2) {
                      operator_delete(local_788._M_dataplus._M_p,
                                      local_788.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_458 != (code *)0x0) {
                    (*local_458)(&local_468,&local_468,__destroy_functor);
                  }
                  if (local_948 != (undefined1  [8])&local_938) {
                    operator_delete((void *)local_948,local_938._M_allocated_capacity + 1);
                  }
                }
                if (local_438 != (code *)0x0) {
                  (*local_438)(&local_448,&local_448,__destroy_functor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_918.alloc.memoryResource !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_918.field_2) {
                  operator_delete(local_918.alloc.memoryResource,local_918.field_2._0_8_ + 1);
                }
              }
              if (local_428._M_left != (_Base_ptr)0x0) {
                (*(code *)local_428._M_left)(&local_428,&local_428,3);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_9a8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_9a8 + 0x10)) {
                operator_delete((void *)local_9a8._0_8_,local_9a8._16_8_ + 1);
              }
            }
            if (local_3f8 != (code *)0x0) {
              (*local_3f8)(&local_408,&local_408,__destroy_functor);
            }
            if (local_148 != (undefined1  [8])(local_140 + 8)) {
              operator_delete((void *)local_148,local_140._8_8_ + 1);
            }
          }
          if (local_3d8 != (code *)0x0) {
            (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8e8._0_8_ != &aStack_8d8) {
            operator_delete((void *)local_8e8._0_8_,aStack_8d8._M_allocated_capacity + 1);
          }
        }
        if (local_3b8 != (code *)0x0) {
          (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
        }
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(long)local_710.alloc.memoryResource + 1);
        }
      }
      if (local_378 != (code *)0x0) {
        (*local_378)(&local_388,&local_388,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_360._0_8_ != &local_350) {
        operator_delete((void *)local_360._0_8_,(long)local_350.alloc.memoryResource + 1);
      }
      if (bVar14 == false) {
        pcVar34 = *local_978;
        if ((*pcVar34 == '-') || (local_7a8._M_string_length != 0)) {
          usage("convert","%s: unknown command flag",pcVar34);
        }
        in_R8 = (_Rb_tree_node_base *)strlen(pcVar34);
        std::__cxx11::string::_M_replace((ulong)&local_7a8,0,(char *)0x0,(ulong)pcVar34);
        local_978 = local_978 + 1;
      }
    } while (*local_978 != (char *)0x0);
    if (local_950 <= 0.0) {
      pcVar34 = "--maxluminance value must be greater than zero";
      goto LAB_0023fb86;
    }
  }
  if (local_95c < 1) {
    pcVar34 = "--repeatpix value must be greater than zero";
LAB_0023fb86:
    usage("convert",pcVar34);
  }
  if ((local_958 == 0.0) && (!NAN(local_958))) {
    pcVar34 = "--scale value must be non-zero";
    goto LAB_0023fb86;
  }
  if (local_740._M_string_length == 0) {
    pcVar34 = "--outfile filename must be specified";
    goto LAB_0023fb86;
  }
  if (local_7a8._M_string_length == 0) {
    pcVar34 = "input filename not specified";
    goto LAB_0023fb86;
  }
  AVar17.memoryResource = pstd::pmr::new_delete_resource();
  local_38.bits = 0;
  pbrt::Image::Read((ImageAndMetadata *)local_360,&local_7a8,AVar17,(ColorEncodingHandle *)&local_38
                   );
  local_720._8_4_ = local_360._8_4_;
  local_720._0_4_ = (undefined4)local_360._0_8_;
  local_720._4_4_ = SUB84(local_360._0_8_,4);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_710,&local_350);
  local_670 = local_2b0;
  vStack_668.alloc.memoryResource = pStack_2a8.memoryResource;
  vStack_668.nAlloc = local_2a0._8_8_;
  vStack_668.nStored = sStack_290;
  auVar47 = ZEXT816(0) << 0x20;
  vStack_668.ptr = (uchar *)local_2a0._0_8_;
  sStack_290 = 0;
  local_648._8_8_ = pHStack_280;
  local_648._0_8_ = local_288.memoryResource;
  sStack_638 = sStack_278;
  uStack_630 = sStack_270;
  vStack_628.alloc.memoryResource = pStack_268.memoryResource;
  vStack_628.ptr = (float *)pHStack_260;
  vStack_628.nAlloc = sStack_258;
  vStack_628.nStored = sStack_250;
  pHStack_280 = (Half *)0x0;
  sStack_278 = SUB168(ZEXT816(0),4);
  sStack_270 = 0;
  sStack_250 = 0;
  local_148[4] = local_244;
  if (local_244 == true) {
    local_244 = false;
    local_148._0_4_ = local_248;
  }
  local_100 = local_200;
  if (local_200 == true) {
    local_200 = false;
    local_140 = (undefined1  [64])local_240;
  }
  local_bc = local_1bc;
  if (local_1bc == true) {
    local_1bc = false;
    local_fc = local_1fc;
  }
  local_a8 = local_1a8;
  if (local_1a8 == true) {
    local_1a8 = false;
    local_b8 = local_1b8;
  }
  local_9c = local_19c;
  if (local_19c == true) {
    local_19c = false;
    local_a4 = local_1a4;
  }
  local_94 = local_194;
  if (local_194 == true) {
    local_194 = false;
    local_98 = local_198;
  }
  local_8c = local_18c;
  if (local_18c == true) {
    local_18c = false;
    local_90 = local_190;
  }
  local_80 = local_180;
  if (local_180 == true) {
    local_180 = false;
    local_88 = local_188;
  }
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var9 = &local_78;
    local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var3 = &local_178._M_impl.super__Rb_tree_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &local_178;
    local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count =
         local_178._M_impl.super__Rb_tree_header._M_node_count;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left =
         local_178._M_impl.super__Rb_tree_header._M_header._M_left;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right =
         local_178._M_impl.super__Rb_tree_header._M_header._M_right;
    in_R8 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
    local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  ch = (char)in_R8;
  (p_Var9->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_2a0 = auVar47;
  pHStack_260 = pHStack_280;
  sStack_258 = sStack_278;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color =
       local_178._M_impl.super__Rb_tree_header._M_header._M_color;
  if ((pbrt *)local_7d0._M_string_length == (pbrt *)0x0) {
    pbrt::Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_8e8,(Image *)local_720);
    uVar4 = local_8e8._8_8_;
    ch = (char)in_R8;
    for (oVar28 = (optional<float>)local_8e8._0_8_; oVar28 != (optional<float>)uVar4;
        oVar28 = (optional<float>)((long)oVar28 + 0x20)) {
      iVar15 = std::__cxx11::string::compare((char *)oVar28);
      if (((iVar15 != 0) && (iVar15 = std::__cxx11::string::compare((char *)oVar28), iVar15 != 0))
         && (iVar15 = std::__cxx11::string::compare((char *)oVar28), iVar15 != 0)) {
        iVar15 = std::__cxx11::string::compare((char *)oVar28);
        ch = (char)in_R8;
        if (iVar15 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_8e8);
          local_8e8._0_8_ = &aStack_8d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"exr","");
          bVar13 = pbrt::HasExtension(&local_740,(string *)local_8e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8e8._0_8_ != &aStack_8d8) {
            operator_delete((void *)local_8e8._0_8_,aStack_8d8._M_allocated_capacity + 1);
          }
          if (!bVar13) {
            fprintf(_stderr,
                    "%s: image has non-RGB channels but converting to an image format that can\'t store them. Converting RGB only.\n"
                    ,local_7a8._M_dataplus._M_p);
            ch = '\x05';
            std::__cxx11::string::_M_replace
                      ((ulong)&local_7d0,0,(char *)local_7d0._M_string_length,0x4a7568);
          }
          goto LAB_0023db10;
        }
      }
      ch = (char)in_R8;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8e8);
LAB_0023db10:
    if ((pbrt *)local_7d0._M_string_length != (pbrt *)0x0) goto LAB_0023db21;
LAB_0023dcdf:
    iVar15 = (int)local_710.nStored;
    uVar19 = local_928._4_4_;
    if ((long)local_928._0_8_ < 0) {
      uVar19 = local_928._0_4_ - local_928._4_4_;
      local_928._4_4_ = uVar19;
    }
    uVar23 = local_928._12_4_;
    if ((long)local_928._8_8_ < 0) {
      uVar23 = local_928._8_4_ - local_928._12_4_;
      local_928._12_4_ = uVar23;
    }
    local_9b0 = CONCAT44(local_720._8_4_,local_720._4_4_);
    if ((-1 < (int)local_928._0_4_) && (-1 < (int)local_928._8_4_)) {
      uVar6 = local_928._0_4_;
      if ((int)uVar19 < (int)local_928._0_4_) {
        uVar6 = uVar19;
      }
      uVar7 = local_928._8_4_;
      if ((int)uVar23 < (int)local_928._8_4_) {
        uVar7 = uVar23;
      }
      local_9a8._0_8_ = CONCAT44(uVar7,uVar6);
      uVar37 = (ulong)uVar19;
      if ((int)uVar19 < (int)local_928._0_4_) {
        uVar37 = local_928._0_8_ & 0xffffffff;
      }
      if ((int)uVar23 < (int)local_928._8_4_) {
        uVar23 = local_928._8_4_;
      }
      local_9a8._8_8_ = uVar37 | (ulong)uVar23 << 0x20;
      AVar17.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::Crop((Image *)local_8e8,(Image *)local_720,(Bounds2i *)local_9a8,AVar17);
      local_720._8_4_ = local_8e8._8_4_;
      local_720._0_4_ = (undefined4)local_8e8._0_8_;
      local_720._4_4_ = SUB84(local_8e8._0_8_,4);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_710,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aStack_8d8);
      local_670 = oStack_838;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&vStack_668,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_830);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_648,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_810);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_648 + 0x20),
                 &local_7f0);
      local_7f0.nStored = 0;
      (*(local_7f0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_7f0.alloc.memoryResource,local_7f0.ptr,local_7f0.nAlloc << 2,4);
      local_7f8 = (_Base_ptr)0x0;
      (*(pStack_810.memoryResource)->_vptr_memory_resource[3])
                (pStack_810.memoryResource,p_Stack_808,(long)local_800 * 2,2);
      auStack_830._24_8_ = 0;
      (*(*(_func_int ***)auStack_830._0_8_)[3])
                (auStack_830._0_8_,auStack_830._8_8_,auStack_830._16_8_,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&aStack_8d8);
      local_9b0 = CONCAT44(local_720._8_4_,local_720._4_4_);
    }
    if ((aligned_storage_t<sizeof(float),_alignof(float)>)local_720._0_4_ !=
        (aligned_storage_t<sizeof(float),_alignof(float)>)0x2) {
      local_40.bits = 0;
      pbrt::Image::ConvertToFormat
                ((Image *)local_8e8,(Image *)local_720,Float,(ColorEncodingHandle *)&local_40);
      local_720._8_4_ = local_8e8._8_4_;
      local_720._0_4_ = (undefined4)local_8e8._0_8_;
      local_720._4_4_ = SUB84(local_8e8._0_8_,4);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_710,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aStack_8d8);
      local_670 = oStack_838;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&vStack_668,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_830);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_648,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_810);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_648 + 0x20),
                 &local_7f0);
      local_7f0.nStored = 0;
      (*(local_7f0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_7f0.alloc.memoryResource,local_7f0.ptr,local_7f0.nAlloc << 2,4);
      local_7f8 = (_Base_ptr)0x0;
      (*(pStack_810.memoryResource)->_vptr_memory_resource[3])
                (pStack_810.memoryResource,p_Stack_808,(long)local_800 * 2,2);
      auStack_830._24_8_ = 0;
      (*(*(_func_int ***)auStack_830._0_8_)[3])
                (auStack_830._0_8_,auStack_830._8_8_,auStack_830._16_8_,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&aStack_8d8);
    }
    uVar37 = local_9b0;
    pIVar36 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
              (local_9b0 >> 0x20);
    local_970 = pIVar36;
    if (local_760._M_string_length == 0) {
LAB_0023e33a:
      if ((local_9b5 == true) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_968 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar38 = 0;
            uVar37 = (long)local_968 << 0x20;
            do {
              if (0 < iVar15) {
                iVar30 = 0;
                fVar45 = 0.0;
                PVar42.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(uVar37 | uVar38);
                do {
                  FVar44 = pbrt::Image::GetChannel
                                     ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  iVar30 = iVar30 + 1;
                  fVar45 = fVar45 + FVar44;
                } while (iVar15 != iVar30);
                if (0 < iVar15) {
                  iVar30 = 0;
                  do {
                    pbrt::Image::SetChannel((Image *)local_720,PVar42,iVar30,fVar45 / (float)iVar15)
                    ;
                    iVar30 = iVar30 + 1;
                  } while (iVar15 != iVar30);
                }
              }
              uVar38 = uVar38 + 1;
            } while (uVar38 != (uVar19 & 0x7fffffff));
          }
          local_968 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_968->alloc).memoryResource + 1);
          pIVar36 = local_970;
        } while (local_968 != local_970);
      }
      if (local_954 != INFINITY) {
        pbrt::Image::Image((Image *)local_8e8,(Image *)local_720);
        _local_948 = ZEXT816(0) << 0x40;
        iVar30 = 9;
        local_938._M_allocated_capacity = 0;
        do {
          sVar39 = (size_t)(int)local_710.nStored;
          local_788._M_dataplus._M_p = local_788._M_dataplus._M_p & 0xffffffff00000000;
          local_918.alloc.memoryResource = pstd::pmr::new_delete_resource();
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_9a8,
                     sVar39,(float *)&local_788,
                     (polymorphic_allocator<float> *)
                     &(((string *)local_928)->field_2)._M_allocated_capacity);
          std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::
          emplace_back<pbrt::ImageChannelValues>
                    ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
                     local_948,(ImageChannelValues *)local_9a8);
          local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
          (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                    (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
          iVar30 = iVar30 + -1;
        } while (iVar30 != 0);
        uVar37 = 0;
        if (0 < (int)local_970) {
          local_3a8 = (ulong)((uint)local_9b0 & 0x7fffffff);
          uVar37 = 0;
          local_9c8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
          do {
            if (0 < (int)local_9b0) {
              uVar38 = 0;
              local_3a0 = (long)local_9c8 << 0x20;
              do {
                local_390 = (Tuple2<pbrt::Point2,_int>)(local_3a0 | uVar38);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_9a8,(Image *)local_720,(Point2i)local_390,
                           (WrapMode2D)0x200000002);
                fVar45 = local_954;
                pIVar36 = local_980;
                if (local_980 ==
                    (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0) {
                  fVar46 = 0.0;
                }
                else {
                  fVar46 = 0.0;
                  TVar18 = (Tuple2<pbrt::Point2,_int>)local_9a8._8_8_;
                  if ((Tuple2<pbrt::Point2,_int>)local_9a8._8_8_ == (Tuple2<pbrt::Point2,_int>)0x0)
                  {
                    TVar18 = (Tuple2<pbrt::Point2,_int>)((long)local_9a8 + 0x10);
                  }
                  pIVar22 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0
                  ;
                  do {
                    fVar46 = fVar46 + *(float *)((long)TVar18 + (long)pIVar22 * 4);
                    pIVar22 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              ((long)&(pIVar22->alloc).memoryResource + 1);
                  } while (local_980 != pIVar22);
                }
                local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0
                ;
                (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                          (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                if (fVar45 <= fVar46 / (float)(long)pIVar36) {
                  local_7ac = (int)uVar37 + 1;
                  iVar30 = -1;
                  iVar40 = 0;
                  do {
                    iVar41 = iVar30 + (int)local_9c8;
                    if ((-1 < iVar41) && (iVar41 < (int)local_970)) {
                      iVar35 = -1;
                      do {
                        iVar16 = (int)uVar38 + iVar35;
                        if (-1 < iVar16) {
                          PVar42.super_Tuple2<pbrt::Point2,_int>.y = iVar41;
                          PVar42.super_Tuple2<pbrt::Point2,_int>.x = iVar16;
                          pbrt::Image::GetChannels
                                    ((ImageChannelValues *)local_9a8,(Image *)local_720,PVar42,
                                     (WrapMode2D)0x200000002);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)local_948 + (long)iVar40 * 0x30),
                                    (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)local_9a8);
                          local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       *)0x0;
                          (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                    (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          iVar40 = iVar40 + 1;
                        }
                        iVar35 = iVar35 + 1;
                      } while (iVar35 != 2);
                    }
                    iVar30 = iVar30 + 1;
                  } while (iVar30 != 2);
                  local_768 = (long)(iVar40 / 2) * 0x30;
                  if (iVar40 != 0) {
                    lVar29 = (long)iVar40;
                    other = local_948;
                    local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )((long)local_948 + lVar29 * 0x30);
                    if (iVar40 < 4) {
LAB_0023f59e:
                      if ((other != (undefined1  [8])local_9d0) &&
                         (pIVar36 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)other + 0x30), pIVar36 != local_9d0)) {
                        pIVar24 = (ImageChannelValues *)0x0;
                        local_968 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)other;
                        do {
                          pIVar24 = pIVar24 + 1;
                          bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                   operator()(pIVar36,(ImageChannelValues *)other,pIVar24);
                          if (bVar13) {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,pIVar36);
                            if ((undefined1  [8])pIVar36 != other &&
                                -1 < (long)pIVar36 - (long)other) {
                              uVar37 = (ulong)pIVar24 / 0x30 + 1;
                              pIVar22 = local_968;
                              do {
                                pbrt::
                                InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                                operator=(pIVar22 + 1,pIVar22);
                                uVar37 = uVar37 - 1;
                                pIVar22 = pIVar22 + -1;
                              } while (1 < uVar37);
                            }
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                  *)local_9a8);
                            local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)0x0;
                            (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                      (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          }
                          else {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,pIVar36);
                            pIVar22 = pIVar36;
                            while( true ) {
                              fVar46 = 0.0;
                              fVar45 = 0.0;
                              auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
                              if (local_980 !=
                                  (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)0x0) {
                                TVar18 = (Tuple2<pbrt::Point2,_int>)local_9a8._8_8_;
                                if ((Tuple2<pbrt::Point2,_int>)local_9a8._8_8_ ==
                                    (Tuple2<pbrt::Point2,_int>)0x0) {
                                  TVar18 = (Tuple2<pbrt::Point2,_int>)((long)local_9a8 + 0x10);
                                }
                                pIVar26 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)0x0;
                                do {
                                  fVar45 = auVar51._0_4_ +
                                           *(float *)((long)TVar18 + (long)pIVar26 * 4);
                                  auVar51 = ZEXT464((uint)fVar45);
                                  pIVar26 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)((long)&(pIVar26->alloc).memoryResource + 1);
                                } while (local_980 != pIVar26);
                              }
                              sVar39 = pIVar22[-1].nStored;
                              if (sVar39 != 0) {
                                fVar46 = 0.0;
                                paVar27 = &pIVar22[-1].field_2;
                                if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)pIVar22[-1].ptr !=
                                    (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                     *)0x0) {
                                  paVar27 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                             *)pIVar22[-1].ptr;
                                }
                                sVar33 = 0;
                                do {
                                  fVar46 = fVar46 + paVar27->fixed[sVar33];
                                  sVar33 = sVar33 + 1;
                                } while (sVar39 != sVar33);
                              }
                              if (fVar46 / (float)(long)sVar39 <= fVar45 / (float)(long)local_980)
                              break;
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar22,pIVar22 + -1);
                              pIVar22 = pIVar22 + -1;
                            }
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar22,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                            local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)0x0;
                            (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                      (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          }
                          local_968 = local_968 + 1;
                          pIVar36 = pIVar36 + 1;
                        } while (pIVar36 != local_9d0);
                      }
                    }
                    else {
                      pIVar24 = (ImageChannelValues *)(lVar29 * 0x30);
                      local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)((ulong)(uint)((int)LZCOUNT(lVar29) * 2) ^ 0x7e);
                      local_968 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)((long)local_948 + local_768);
                      do {
                        pIVar36 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)((long)other + 0x30);
                        pIVar26 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)((long)other + ((ulong)pIVar24 / 0x60) * 0x30);
                        pIVar22 = local_9d0 + -1;
                        bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                 operator()(pIVar36,(ImageChannelValues *)pIVar26,pIVar24);
                        if (bVar13) {
                          bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                   operator()(pIVar26,(ImageChannelValues *)pIVar22,__it2);
                          if (bVar13) {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar26);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar26,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                            local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)0x0;
                            (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                      (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                            pIVar24 = extraout_RDX;
                          }
                          else {
                            bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()(pIVar36,(ImageChannelValues *)pIVar22,__it2_00);
                            if (bVar13) {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar22);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar22,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                              local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)0x0;
                              (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                        (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                              pIVar24 = extraout_RDX_01;
                            }
                            else {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar36);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar36,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                              local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)0x0;
                              (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                        (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                              pIVar24 = extraout_RDX_03;
                            }
                          }
                        }
                        else {
                          bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                   operator()(pIVar36,(ImageChannelValues *)pIVar22,__it2);
                          if (bVar13) {
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar36);
                            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                            ::operator=(pIVar36,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                            local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)0x0;
                            (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                      (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                            pIVar24 = extraout_RDX_00;
                          }
                          else {
                            bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()(pIVar26,(ImageChannelValues *)pIVar22,__it2_01);
                            if (bVar13) {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar22);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar22,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                              local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)0x0;
                              (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                        (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                              pIVar24 = extraout_RDX_02;
                            }
                            else {
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8,
                                            (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)other,pIVar26);
                              pbrt::
                              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                              operator=(pIVar26,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)local_9a8);
                              local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           *)0x0;
                              (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                        (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                              pIVar24 = extraout_RDX_04;
                            }
                          }
                        }
                        local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)((long)local_9c0 - 1);
                        pIVar22 = local_9d0;
                        while( true ) {
                          do {
                            pIVar26 = pIVar36;
                            bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()(pIVar26,(ImageChannelValues *)other,pIVar24);
                            pIVar24 = extraout_RDX_05;
                            pIVar36 = pIVar26 + 1;
                          } while (bVar13);
                          do {
                            pIVar22 = pIVar22 + -1;
                            bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                     operator()((void *)other,(ImageChannelValues *)pIVar22,pIVar24)
                            ;
                            pIVar24 = extraout_RDX_06;
                          } while (bVar13);
                          if (pIVar22 <= pIVar26) break;
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8,pIVar26);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=(pIVar26,pIVar22);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=(pIVar22,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)local_9a8);
                          local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       *)0x0;
                          (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                    (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          pIVar24 = extraout_RDX_07;
                        }
                        if (pIVar26 <= local_968) {
                          other = (undefined1  [8])pIVar26;
                          pIVar26 = local_9d0;
                        }
                        pIVar24 = (ImageChannelValues *)((long)pIVar26 - (long)other);
                        local_9d0 = pIVar26;
                        if ((long)pIVar24 < 0x91) goto LAB_0023f59e;
                      } while (local_9c0 !=
                               (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                               0x0);
                      pIVar36 = local_968 + 1;
                      pIVar25 = (ImageChannelValues *)
                                (((long)pIVar36 - (long)other >> 4) * -0x5555555555555555);
                      pIVar24 = pIVar25;
                      if (0x5f < (long)pIVar36 - (long)other) {
                        uVar37 = (ulong)((long)&pIVar25[-1].
                                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                .nStored + 6U) >> 1;
                        pIVar22 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)((long)other + uVar37 * 0x30);
                        local_398 = pIVar36;
                        do {
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8,pIVar22);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)&((string *)local_928)->field_2,
                                        (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8);
                          std::
                          __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                                    (other,uVar37,pIVar25,
                                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      *)&((string *)local_928)->field_2);
                          local_918.nStored = 0;
                          (*(local_918.alloc.memoryResource)->_vptr_memory_resource[3])
                                    (local_918.alloc.memoryResource,local_918.ptr,
                                     local_918.nAlloc << 2,4);
                          local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       *)0x0;
                          (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                    (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          pIVar22 = pIVar22 + -1;
                          bVar13 = uVar37 != 0;
                          uVar37 = uVar37 - 1;
                          pIVar24 = extraout_RDX_08;
                          pIVar36 = local_398;
                        } while (bVar13);
                      }
                      for (; pIVar36 < pIVar26; pIVar36 = pIVar36 + 1) {
                        bVar13 = __gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::$_1>::
                                 operator()(pIVar36,(ImageChannelValues *)other,pIVar24);
                        pIVar24 = extraout_RDX_09;
                        if (bVar13) {
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8,pIVar36);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          operator=(pIVar36,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             *)other);
                          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)&((string *)local_928)->field_2,
                                        (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8);
                          std::
                          __adjust_heap<pbrt::ImageChannelValues*,long,pbrt::ImageChannelValues,__gnu_cxx::__ops::_Iter_comp_iter<convert(int,char**)::__1>>
                                    (other,0,pIVar25,
                                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                      *)&((string *)local_928)->field_2);
                          local_918.nStored = 0;
                          (*(local_918.alloc.memoryResource)->_vptr_memory_resource[3])
                                    (local_918.alloc.memoryResource,local_918.ptr,
                                     local_918.nAlloc << 2,4);
                          local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       *)0x0;
                          (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                    (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                          pIVar24 = extraout_RDX_10;
                        }
                      }
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)local_9a8,
                                    (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)other);
                      pIVar36 = local_968;
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator=((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )other,local_968);
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator=(pIVar36,(InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         *)local_9a8);
                      local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   *)0x0;
                      (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                                (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
                    }
                  }
                  pbrt::Image::SetChannels
                            ((Image *)local_8e8,(Point2i)local_390,
                             (ImageChannelValues *)((long)local_948 + local_768));
                  uVar37 = (ulong)local_7ac;
                }
                uVar38 = uVar38 + 1;
              } while (uVar38 != local_3a8);
            }
            local_9c8 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(local_9c8->alloc).memoryResource + 1);
          } while (local_9c8 != local_970);
        }
        pIVar36 = local_970;
        pstd::swap<pbrt::Image>((Image *)local_720,(Image *)local_8e8);
        fprintf(_stderr,"%s: despiked %d pixels\n",local_7a8._M_dataplus._M_p,uVar37);
        std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::~vector
                  ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
                   local_948);
        local_7f0.nStored = 0;
        (*(local_7f0.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_7f0.alloc.memoryResource,local_7f0.ptr,local_7f0.nAlloc << 2,4);
        local_7f8 = (_Base_ptr)0x0;
        (*(pStack_810.memoryResource)->_vptr_memory_resource[3])
                  (pStack_810.memoryResource,p_Stack_808,(long)local_800 * 2,2);
        auStack_830._24_8_ = 0;
        (*(*(_func_int ***)auStack_830._0_8_)[3])
                  (auStack_830._0_8_,auStack_830._8_8_,auStack_830._16_8_,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aStack_8d8);
      }
      if (((local_958 != 1.0) || (NAN(local_958))) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar37 = 0;
            do {
              if (0 < iVar15) {
                iVar30 = 0;
                PVar42.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_9c0 << 0x20 | uVar37);
                do {
                  fVar45 = local_958;
                  FVar44 = pbrt::Image::GetChannel
                                     ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel((Image *)local_720,PVar42,iVar30,FVar44 * fVar45);
                  iVar30 = iVar30 + 1;
                } while (iVar15 != iVar30);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != (uVar19 & 0x7fffffff));
          }
          local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_9c0->alloc).memoryResource + 1);
          pIVar36 = local_970;
        } while (local_9c0 != local_970);
      }
      if (((local_94c != 1.0) || (NAN(local_94c))) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar37 = 0;
            do {
              if (0 < iVar15) {
                iVar30 = 0;
                PVar42.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_9d0 << 0x20 | uVar37);
                do {
                  auVar51._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  auVar51._4_60_ = extraout_var;
                  auVar47 = vmaxss_avx(auVar51._0_16_,ZEXT416(0));
                  fVar45 = powf(auVar47._0_4_,local_94c);
                  pbrt::Image::SetChannel((Image *)local_720,PVar42,iVar30,fVar45);
                  iVar30 = iVar30 + 1;
                } while (iVar15 != iVar30);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != (uVar19 & 0x7fffffff));
          }
          local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_9d0->alloc).memoryResource + 1);
          pIVar36 = local_970;
        } while (local_9d0 != local_970);
      }
      if ((local_9b3 == true) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar37 = 0;
            do {
              PVar42.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)((long)local_9c0 << 0x20 | uVar37);
              pbrt::Image::GetChannels
                        ((ImageChannelValues *)local_8e8,(Image *)local_720,PVar42,
                         (WrapMode2D)0x200000002);
              uVar4 = auStack_8c8._8_8_;
              if (auStack_8c8._8_8_ == 0) {
                fVar45 = 0.0;
              }
              else {
                fVar45 = 0.0;
                oVar28 = (optional<float>)local_8e8._8_8_;
                if ((optional<float>)local_8e8._8_8_ == (optional<float>)0x0) {
                  oVar28 = (optional<float>)&aStack_8d8;
                }
                sVar21 = 0;
                do {
                  fVar45 = fVar45 + *(float *)((long)oVar28 + sVar21 * 4);
                  sVar21 = sVar21 + 1;
                } while (auStack_8c8._8_8_ != sVar21);
              }
              auStack_8c8._8_8_ = 0;
              (**(code **)(*(size_type *)local_8e8._0_8_ + 0x18))
                        (local_8e8._0_8_,local_8e8._8_8_,auStack_8c8._0_8_ << 2,4);
              if (0 < iVar15) {
                iVar30 = 0;
                fVar46 = local_950 * local_950;
                do {
                  FVar44 = pbrt::Image::GetChannel
                                     ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel
                            ((Image *)local_720,PVar42,iVar30,
                             FVar44 * (((fVar45 / (float)(long)uVar4) / fVar46 + 1.0) /
                                      (fVar45 / (float)(long)uVar4 + 1.0)));
                  iVar30 = iVar30 + 1;
                } while (iVar15 != iVar30);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != (uVar19 & 0x7fffffff));
          }
          local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_9c0->alloc).memoryResource + 1);
          pIVar36 = local_970;
        } while (local_9c0 != local_970);
      }
      if ((local_9b4 == true) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar37 = 0;
            do {
              PVar42.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)((long)local_9c0 << 0x20 | uVar37);
              fVar45 = pbrt::Image::GetChannel((Image *)local_720,PVar42,0,(WrapMode2D)0x200000002);
              if (1 < iVar15) {
                iVar30 = 1;
                do {
                  auVar48._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  auVar48._4_60_ = extraout_var_00;
                  iVar30 = iVar30 + 1;
                  auVar47 = vmaxss_avx(auVar48._0_16_,ZEXT416((uint)fVar45));
                  fVar45 = auVar47._0_4_;
                } while (iVar15 != iVar30);
              }
              if (1.0 < fVar45 && 0 < iVar15) {
                iVar30 = 0;
                do {
                  FVar44 = pbrt::Image::GetChannel
                                     ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  pbrt::Image::SetChannel((Image *)local_720,PVar42,iVar30,FVar44 / fVar45);
                  iVar30 = iVar30 + 1;
                } while (iVar15 != iVar30);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != (uVar19 & 0x7fffffff));
          }
          local_9c0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_9c0->alloc).memoryResource + 1);
          pIVar36 = local_970;
        } while (local_9c0 != local_970);
      }
      if ((local_9b1 == true) && (0 < (int)pIVar36)) {
        uVar19 = (uint)local_9b0;
        local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
        do {
          if (0 < (int)local_9b0) {
            uVar37 = 0;
            do {
              if (0 < iVar15) {
                iVar30 = 0;
                PVar42.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_9d0 << 0x20 | uVar37);
                do {
                  auVar49._0_4_ =
                       pbrt::Image::GetChannel
                                 ((Image *)local_720,PVar42,iVar30,(WrapMode2D)0x200000002);
                  auVar49._4_60_ = extraout_var_01;
                  auVar47 = auVar49._0_16_;
                  FVar44 = 0.0;
                  if (0.0 < auVar49._0_4_) {
                    auVar50 = vfmadd213ss_fma(SUB6416(ZEXT464(0x401b851f),0),auVar47,
                                              ZEXT416(0x3f170a3d));
                    auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x4020a3d7),0),auVar47,
                                             ZEXT416(0x3cf5c28f));
                    auVar47 = vfmadd213ss_fma(auVar50,auVar47,ZEXT416(0x3e0f5c29));
                    auVar50 = ZEXT416((uint)((auVar49._0_4_ * auVar5._0_4_) / auVar47._0_4_));
                    auVar47 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar50);
                    uVar4 = vcmpss_avx512f(auVar50,ZEXT816(0) << 0x20,1);
                    FVar44 = (Float)((uint)!(bool)((byte)uVar4 & 1) * auVar47._0_4_);
                  }
                  pbrt::Image::SetChannel((Image *)local_720,PVar42,iVar30,FVar44);
                  iVar30 = iVar30 + 1;
                } while (iVar15 != iVar30);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != (uVar19 & 0x7fffffff));
          }
          local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                      ((long)&(local_9d0->alloc).memoryResource + 1);
        } while (local_9d0 != local_970);
      }
      format = local_720._0_4_;
      iVar30 = local_95c;
      if (1 < local_95c) {
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_9a8,(Image *)local_720);
        pIVar36 = local_970;
        uVar4 = local_9a8._0_8_;
        resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar30 * (int)local_9b0;
        lVar29 = local_9a8._8_8_ - local_9a8._0_8_;
        iVar40 = (int)local_970;
        local_48 = local_670;
        AVar17.memoryResource = pstd::pmr::new_delete_resource();
        resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar30 * iVar40;
        channels_00.n = lVar29 >> 5;
        channels_00.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4
        ;
        pbrt::Image::Image((Image *)local_8e8,format,resolution,channels_00,
                           (ColorEncodingHandle *)&local_48,AVar17);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_9a8);
        if (0 < local_95c * iVar40) {
          uVar37 = 0;
          iVar30 = local_95c;
          do {
            if (0 < iVar30 * (int)local_9b0) {
              uVar38 = 0;
              lVar29 = (long)iVar30;
              do {
                if (0 < iVar15) {
                  iVar40 = 0;
                  lVar32 = (long)iVar30;
                  do {
                    FVar44 = pbrt::Image::GetChannel
                                       ((Image *)local_720,
                                        (Point2i)((long)((ulong)(uint)((int)uVar38 >> 0x1f) << 0x20
                                                        | uVar38 & 0xffffffff) / lVar32 &
                                                  0xffffffffU |
                                                 (long)((ulong)(uint)((int)uVar37 >> 0x1f) << 0x20 |
                                                       uVar37 & 0xffffffff) / lVar29 << 0x20),iVar40
                                        ,(WrapMode2D)0x200000002);
                    pbrt::Image::SetChannel
                              ((Image *)local_8e8,(Point2i)(uVar37 << 0x20 | uVar38),iVar40,FVar44);
                    iVar40 = iVar40 + 1;
                    pIVar36 = local_970;
                    iVar30 = local_95c;
                  } while (iVar15 != iVar40);
                }
                uVar38 = uVar38 + 1;
              } while ((long)uVar38 < (long)(iVar30 * (int)local_9b0));
            }
            uVar37 = uVar37 + 1;
          } while ((long)uVar37 < (long)(iVar30 * (int)pIVar36));
        }
        local_720._8_4_ = local_8e8._8_4_;
        local_720._0_4_ = (undefined4)local_8e8._0_8_;
        local_720._4_4_ = SUB84(local_8e8._0_8_,4);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_710,
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&aStack_8d8);
        local_670 = oStack_838;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&vStack_668,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   auStack_830);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_648,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_810)
        ;
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_648 + 0x20),
                   &local_7f0);
        local_7f0.nStored = 0;
        (*(local_7f0.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_7f0.alloc.memoryResource,local_7f0.ptr,local_7f0.nAlloc << 2,4);
        local_7f8 = (_Base_ptr)0x0;
        (*(pStack_810.memoryResource)->_vptr_memory_resource[3])
                  (pStack_810.memoryResource,p_Stack_808,(long)local_800 * 2,2);
        auStack_830._24_8_ = 0;
        (*(*(_func_int ***)auStack_830._0_8_)[3])
                  (auStack_830._0_8_,auStack_830._8_8_,auStack_830._16_8_,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aStack_8d8);
      }
      if (local_9b2 == true) {
        pbrt::Image::FlipY((Image *)local_720);
      }
      local_800 = (_Base_ptr)&pStack_810;
      auStack_830._8_8_ =
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      auStack_830._16_8_ = 0;
      auStack_830._24_8_ = 0;
      pStack_810.memoryResource = (memory_resource *)0x0;
      p_Stack_808 = (_Base_ptr)0x0;
      alStack_898[6] = 0;
      alStack_898[7] = 0;
      aStack_858._0_8_ = 0;
      aStack_858._8_8_ = 0;
      sStack_848 = 0;
      local_840 = 0;
      oStack_838.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      oStack_838.set = false;
      oStack_838._5_3_ = 0;
      auStack_830._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      auStack_830[4] = false;
      auStack_830._5_3_ = 0;
      local_8a8[0] = 0;
      local_8a8[1] = 0;
      alStack_898[0] = 0;
      alStack_898[1] = 0;
      alStack_898[2] = 0;
      alStack_898[3] = 0;
      alStack_898[4] = 0;
      alStack_898[5] = 0;
      local_8e8._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_8e8[4] = false;
      local_8e8._5_3_ = 0;
      local_8e8._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_8e8[0xc] = false;
      local_8e8._13_3_ = 0;
      aStack_8d8._M_allocated_capacity = 0;
      aStack_8d8._8_8_ = 0;
      auStack_8c8._0_8_ = (pointer)0x0;
      auStack_8c8._8_8_ = 0;
      auStack_8c8._16_8_ = 0;
      auStack_8c8._24_8_ = 0;
      local_7f0.alloc.memoryResource = (memory_resource *)0x0;
      local_7f8 = local_800;
      bVar13 = pbrt::Image::Write((Image *)local_720,&local_740,(ImageMetadata *)local_8e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(auStack_830 + 0x18));
      uVar19 = (uint)!bVar13;
      goto LAB_0023f89d;
    }
    to = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
          )pbrt::RGBColorSpace::GetNamed(&local_760);
    if (to == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0) {
      convert();
    }
    else {
      local_8e8._0_8_ = &aStack_8d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"R","");
      auStack_8c8._0_8_ = auStack_8c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_8c8,"G","");
      _Var43._M_p = (pointer)alStack_898;
      local_8a8[0] = (long)_Var43._M_p;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"B","");
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e8;
      pbrt::Image::GetChannelDesc
                ((ImageChannelDesc *)local_9a8,(Image *)local_720,requestedChannels_00);
      lVar29 = -0x60;
      do {
        if ((long *)_Var43._M_p != *(long **)((long)_Var43._M_p + -0x10)) {
          operator_delete(*(long **)((long)_Var43._M_p + -0x10),*(long *)_Var43._M_p + 1);
        }
        pIVar22 = local_980;
        _Var43._M_p = _Var43._M_p + -0x20;
        lVar29 = lVar29 + 0x20;
      } while (lVar29 != 0);
      if (local_980 == (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0) {
        convert();
      }
      else {
        local_968 = local_980;
        from = local_88;
        if (local_88 ==
            (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
             )0x0) {
          from = pbrt::RGBColorSpace::sRGB;
        }
        if (local_80 == '\0') {
          from = pbrt::RGBColorSpace::sRGB;
        }
        pbrt::ConvertRGBColorSpace
                  ((SquareMatrix<3> *)&((string *)local_928)->field_2,(RGBColorSpace *)from,
                   (RGBColorSpace *)to);
        if (0 < (int)(uVar37 >> 0x20)) {
          uVar19 = (uint)local_9b0;
          local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
          do {
            if (0 < (int)local_9b0) {
              uVar37 = 0;
              do {
                PVar42.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((long)local_9d0 << 0x20 | uVar37);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_8e8,(Image *)local_720,PVar42,
                           (ImageChannelDesc *)local_9a8,(WrapMode2D)0x200000002);
                auVar47._8_8_ = 0;
                auVar47._0_8_ = pIStack_940;
                _local_948 = auVar47 << 0x40;
                local_788._M_dataplus._M_p = local_788._M_dataplus._M_p & 0xffffffff00000000;
                oVar28 = (optional<float>)local_8e8._8_8_;
                if ((optional<float>)local_8e8._8_8_ == (optional<float>)0x0) {
                  oVar28 = (optional<float>)&aStack_8d8;
                }
                paVar20 = &((string *)local_928)->field_2;
                lVar29 = 0;
                do {
                  iVar30 = (int)lVar29;
                  psVar31 = (string *)local_948;
                  if ((iVar30 != 0) && (psVar31 = (string *)(local_948 + 4), iVar30 != 1)) {
                    psVar31 = &local_788;
                  }
                  *(undefined4 *)&(psVar31->_M_dataplus)._M_p = 0;
                  lVar32 = 0;
                  do {
                    lVar1 = lVar32 * 4;
                    psVar31 = (string *)local_948;
                    if ((iVar30 != 0) && (psVar31 = (string *)(local_948 + 4), iVar30 != 1)) {
                      psVar31 = &local_788;
                    }
                    lVar2 = lVar32 * 4;
                    lVar32 = lVar32 + 1;
                    auVar47 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)oVar28 + lVar1)),
                                              ZEXT416(*(uint *)((long)paVar20 + lVar2)),
                                              ZEXT416(*(uint *)&(psVar31->_M_dataplus)._M_p));
                    *(int *)&(psVar31->_M_dataplus)._M_p = auVar47._0_4_;
                  } while (lVar32 != 3);
                  lVar29 = lVar29 + 1;
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar20->_M_local_buf + 0xc);
                } while (lVar29 != 3);
                pIStack_940._0_4_ = local_788._M_dataplus._M_p._0_4_;
                values.n = 3;
                values.ptr = (float *)local_948;
                pbrt::Image::SetChannels
                          ((Image *)local_720,PVar42,(ImageChannelDesc *)local_9a8,values);
                auStack_8c8._8_8_ = 0;
                (**(code **)(*(size_type *)local_8e8._0_8_ + 0x18))
                          (local_8e8._0_8_,local_8e8._8_8_,auStack_8c8._0_8_ << 2,4);
                uVar37 = uVar37 + 1;
              } while (uVar37 != (uVar19 & 0x7fffffff));
            }
            local_9d0 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        ((long)&(local_9d0->alloc).memoryResource + 1);
            pIVar36 = local_970;
          } while (local_9d0 != local_970);
        }
        local_80 = '\x01';
        pIVar22 = local_968;
        local_88 = to;
      }
      local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
      (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
                (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
      if (pIVar22 != (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0)
      goto LAB_0023e33a;
    }
  }
  else {
LAB_0023db21:
    str._M_str = (char *)0x2c;
    str._M_len = (size_t)local_7d0._M_dataplus._M_p;
    pbrt::SplitString_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&((string *)local_928)->field_2,(pbrt *)local_7d0._M_string_length,str,ch);
    requestedChannels.n = (long)local_918.ptr - (long)local_918.alloc.memoryResource >> 5;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_918.alloc.memoryResource;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)local_9a8,(Image *)local_720,requestedChannels);
    pIVar36 = local_980;
    if (local_980 == (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0) {
      fprintf(_stderr,"%s: image doesn\'t have channels \"%s\".\n",local_7a8._M_dataplus._M_p,
              local_7d0._M_dataplus._M_p);
    }
    else {
      AVar17.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::SelectChannels
                ((Image *)local_8e8,(Image *)local_720,(ImageChannelDesc *)local_9a8,AVar17);
      local_720._8_4_ = local_8e8._8_4_;
      local_720._0_4_ = (undefined4)local_8e8._0_8_;
      local_720._4_4_ = SUB84(local_8e8._0_8_,4);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_710,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&aStack_8d8);
      local_670 = oStack_838;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&vStack_668,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 auStack_830);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_648,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)&pStack_810);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_648 + 0x20),
                 &local_7f0);
      local_7f0.nStored = 0;
      (*(local_7f0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_7f0.alloc.memoryResource,local_7f0.ptr,local_7f0.nAlloc << 2,4);
      local_7f8 = (_Base_ptr)0x0;
      (*(pStack_810.memoryResource)->_vptr_memory_resource[3])
                (pStack_810.memoryResource,p_Stack_808,(long)local_800 * 2,2);
      auStack_830._24_8_ = 0;
      (*(*(_func_int ***)auStack_830._0_8_)[3])
                (auStack_830._0_8_,auStack_830._8_8_,auStack_830._16_8_,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&aStack_8d8);
    }
    local_980 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
    (**(code **)(((_Alloc_hider *)local_9a8._0_8_)->_M_p + 0x18))
              (local_9a8._0_8_,local_9a8._8_8_,local_988 << 2,4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&((string *)local_928)->field_2);
    if (pIVar36 != (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)0x0)
    goto LAB_0023dcdf;
  }
  uVar19 = 1;
LAB_0023f89d:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_78);
  vStack_628.nStored = 0;
  auVar51 = _local_648;
  pVar11.memoryResource = vStack_628.alloc.memoryResource;
  pfVar12 = vStack_628.ptr;
  ppp_Var8 = &(vStack_628.alloc.memoryResource)->_vptr_memory_resource;
  lVar29 = vStack_628.nAlloc << 2;
  _local_648 = auVar51;
  (*(*ppp_Var8)[3])(pVar11.memoryResource,pfVar12,lVar29,4);
  auVar51 = _local_648;
  uStack_630 = 0;
  auVar48 = _local_648;
  local_648._0_8_ = auVar51._0_8_;
  uVar4 = local_648._0_8_;
  sStack_638 = auVar51._16_8_;
  local_648._8_8_ = auVar51._8_8_;
  uVar10 = local_648._8_8_;
  ppp_Var8 = (_func_int ***)local_648._0_8_;
  lVar29 = sStack_638 * 2;
  _local_648 = auVar48;
  (*(*ppp_Var8)[3])(uVar4,uVar10,lVar29,2);
  vStack_668.nStored = 0;
  (*(vStack_668.alloc.memoryResource)->_vptr_memory_resource[3])
            (vStack_668.alloc.memoryResource,vStack_668.ptr,vStack_668.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_710);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_178);
  if (local_180 == true) {
    local_180 = false;
  }
  if (local_18c == true) {
    local_18c = false;
  }
  if (local_194 == true) {
    local_194 = false;
  }
  if (local_19c == true) {
    local_19c = false;
  }
  if (local_1a8 == true) {
    local_1a8 = false;
  }
  if (local_1bc == true) {
    local_1bc = false;
  }
  if (local_200 == true) {
    local_200 = false;
  }
  if (local_244 == true) {
    local_244 = false;
  }
  sStack_250 = 0;
  (*(pStack_268.memoryResource)->_vptr_memory_resource[3])
            (pStack_268.memoryResource,pHStack_260,sStack_258 << 2,4);
  sStack_270 = 0;
  (*(local_288.memoryResource)->_vptr_memory_resource[3])
            (local_288.memoryResource,pHStack_280,sStack_278 * 2,2);
  sStack_290 = 0;
  (*(pStack_2a8.memoryResource)->_vptr_memory_resource[3])
            (pStack_2a8.memoryResource,local_2a0._0_8_,local_2a0._8_8_,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,
                    CONCAT71(local_7d0.field_2._M_allocated_capacity._1_7_,
                             local_7d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,
                    CONCAT71(local_760.field_2._M_allocated_capacity._1_7_,
                             local_760.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,
                    CONCAT71(local_740.field_2._M_allocated_capacity._1_7_,
                             local_740.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,
                    CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                             local_7a8.field_2._M_local_buf[0]) + 1);
  }
  return uVar19;
}

Assistant:

int convert(int argc, char *argv[]) {
    bool acesFilmic = false;
    float scale = 1.f, gamma = 1.f;
    int repeat = 1;
    bool flipy = false;
    bool tonemap = false;
    Float maxY = 1.;
    Float despikeLimit = Infinity;
    bool preserveColors = false;
    bool bw = false;
    std::string inFile, outFile;
    std::string colorspace;
    std::string channelNames;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("convert", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "acesfilmic", &acesFilmic, onError) ||
            ParseArg(&argv, "bw", &bw, onError) ||
            ParseArg(&argv, "channels", &channelNames, onError) ||
            ParseArg(&argv, "colorspace", &colorspace, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError) ||
            ParseArg(&argv, "despike", &despikeLimit, onError) ||
            ParseArg(&argv, "flipy", &flipy, onError) ||
            ParseArg(&argv, "gamma", &gamma, onError) ||
            ParseArg(&argv, "maxluminance", &maxY, onError) ||
            ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "preservecolors", &preserveColors, onError) ||
            ParseArg(&argv, "repeatpix", &repeat, onError) ||
            ParseArg(&argv, "scale", &scale, onError) ||
            ParseArg(&argv, "tonemap", &tonemap, onError)) {
            // success
        } else if (argv[0][0] != '-' && inFile.empty()) {
            inFile = *argv;
            ++argv;
        } else
            usage("convert", "%s: unknown command flag", *argv);
    }

    if (maxY <= 0)
        usage("convert", "--maxluminance value must be greater than zero");
    if (repeat <= 0)
        usage("convert", "--repeatpix value must be greater than zero");
    if (scale == 0)
        usage("convert", "--scale value must be non-zero");
    if (outFile.empty())
        usage("convert", "--outfile filename must be specified");
    if (inFile.empty())
        usage("convert", "input filename not specified");

    ImageAndMetadata imRead = Image::Read(inFile);
    Image image = std::move(imRead.image);
    ImageMetadata metadata = std::move(imRead.metadata);

    if (channelNames.empty()) {
        // If the input image has AOVs and the target image is a regular
        // format, then just grab R,G,B...
        bool hasAOVs = false;
        for (const std::string &name : image.ChannelNames())
            if (name != "R" && name != "G" && name != "B" && name != "A") {
                hasAOVs = true;
                break;
            }

        if (hasAOVs && !HasExtension(outFile, "exr")) {
            fprintf(stderr,
                    "%s: image has non-RGB channels but converting to an "
                    "image format that can't store them. Converting RGB only.\n",
                    inFile.c_str());
            channelNames = "R,G,B";
        }
    }

    if (!channelNames.empty()) {
        std::vector<std::string> splitChannelNames = SplitString(channelNames, ',');
        ImageChannelDesc desc = image.GetChannelDesc(splitChannelNames);
        if (!desc) {
            fprintf(stderr, "%s: image doesn't have channels \"%s\".\n", inFile.c_str(),
                    channelNames.c_str());
            return 1;
        }
        image = image.SelectChannels(desc);
    }

    Point2i res = image.Resolution();
    int nc = image.NChannels();

    // Crop
    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0) {
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
        res = image.Resolution();
    }

    // Convert to a 32-bit format for maximum accuracy in the following
    // processing.
    if (!Is32Bit(image.Format()))
        image = image.ConvertToFormat(PixelFormat::Float);

    if (!colorspace.empty()) {
        const RGBColorSpace *dest = RGBColorSpace::GetNamed(colorspace);
        if (!dest) {
            fprintf(stderr, "%s: color space unknown.\n", colorspace.c_str());
            return 1;
        }
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc) {
            fprintf(stderr, "%s: doesn't have R, G, B channels.\n", inFile.c_str());
            return 1;
        }

        const RGBColorSpace *srcColorSpace = (metadata.colorSpace && *metadata.colorSpace)
                                                 ? *metadata.colorSpace
                                                 : RGBColorSpace::sRGB;
        SquareMatrix<3> m = ConvertRGBColorSpace(*srcColorSpace, *dest);
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                ImageChannelValues channels = image.GetChannels({x, y}, rgbDesc);
                RGB rgb = Mul<RGB>(m, channels);
                image.SetChannels({x, y}, rgbDesc, {rgb.r, rgb.g, rgb.b});
            }
        metadata.colorSpace = dest;
    }

    if (bw) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float sum = 0;
                for (int c = 0; c < nc; ++c)
                    sum += image.GetChannel({x, y}, c);
                sum /= nc;
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, sum);
            }
    }

    if (despikeLimit < Infinity) {
        Image filteredImg = image;
        int despikeCount = 0;
        std::vector<ImageChannelValues> neighbors;
        for (int i = 0; i < 9; ++i)
            neighbors.push_back(ImageChannelValues(image.NChannels()));

        for (int y = 0; y < res.y; ++y) {
            for (int x = 0; x < res.x; ++x) {
                if (image.GetChannels({x, y}).Average() < despikeLimit)
                    continue;

                // Copy all of the valid neighbor pixels into neighbors[].
                ++despikeCount;
                int validNeighbors = 0;
                for (int dy = -1; dy <= 1; ++dy) {
                    if (y + dy < 0 || y + dy >= res.y)
                        continue;
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (x + dx < 0 || x + dx > res.x)
                            continue;
                        neighbors[validNeighbors++] = image.GetChannels({x + dx, y + dy});
                    }
                }

                // Find the median of the neighbors, sorted by average value.
                int mid = validNeighbors / 2;
                std::nth_element(
                    &neighbors[0], &neighbors[mid], &neighbors[validNeighbors],
                    [](const ImageChannelValues &a, const ImageChannelValues &b) -> bool {
                        return a.Average() < b.Average();
                    });
                filteredImg.SetChannels({x, y}, neighbors[mid]);
            }
        }
        pstd::swap(image, filteredImg);
        fprintf(stderr, "%s: despiked %d pixels\n", inFile.c_str(), despikeCount);
    }

    if (scale != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
    }

    if (gamma != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel(
                        {x, y}, c,
                        std::pow(std::max<Float>(0, image.GetChannel({x, y}, c)), gamma));
    }

    if (tonemap) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float lum = image.GetChannels({x, y}).Average();
                // Reinhard et al. photographic tone mapping operator.
                Float scale = (1 + lum / (maxY * maxY)) / (1 + lum);
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
            }
    }

    if (preserveColors) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float m = image.GetChannel({x, y}, 0);
                for (int c = 1; c < nc; ++c)
                    m = std::max(m, image.GetChannel({x, y}, c));
                if (m > 1) {
                    for (int c = 0; c < nc; ++c)
                        image.SetChannel({x, y}, c, image.GetChannel({x, y}, c) / m);
                }
            }
    }

    if (acesFilmic) {
        // Approximation via
        // https://knarkowicz.wordpress.com/2016/01/06/aces-filmic-tone-mapping-curve/
        auto ACESFilm = [](Float x) -> Float {
            if (x <= 0)
                return 0;
            Float a = 2.51f;
            Float b = 0.03f;
            Float c = 2.43f;
            Float d = 0.59f;
            Float e = 0.14f;
            return Clamp((x * (a * x + b)) / (x * (c * x + d) + e), 0, 1);
        };

        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                for (int c = 0; c < nc; ++c) {
                    Float v = image.GetChannel({x, y}, c);
                    v = ACESFilm(v);
                    image.SetChannel({x, y}, c, v);
                }
            }
    }

    if (repeat > 1) {
        Image scaledImage(image.Format(), Point2i(res.x * repeat, res.y * repeat),
                          image.ChannelNames(), image.Encoding());
        for (int y = 0; y < repeat * res.y; ++y) {
            int yy = y / repeat;
            for (int x = 0; x < repeat * res.x; ++x) {
                int xx = x / repeat;
                for (int c = 0; c < nc; ++c)
                    scaledImage.SetChannel({x, y}, c, image.GetChannel({xx, yy}, c));
            }
        }
        image = std::move(scaledImage);
        res = image.Resolution();
    }

    if (flipy)
        image.FlipY();

    if (!image.Write(outFile))
        return 1;

    return 0;
}